

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O3

uint8 * __thiscall
Messages::Person_PhoneNumber::_InternalSerialize
          (Person_PhoneNumber *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  string *psVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  uint8 *puVar6;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar2 = (this->number_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "Messages.Person.PhoneNumber.number");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,1,(this->number_).ptr_,target);
  }
  if ((uVar1 & 2) != 0) {
    if (*(uint8 **)stream <= target) {
      target = (uint8 *)google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback
                                  ((uchar *)stream);
    }
    uVar1 = this->type_;
    *target = '\x10';
    if ((ulong)(long)(int)uVar1 < 0x80) {
      target[1] = (byte)uVar1;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar1 | 0x80;
      uVar4 = (ulong)(long)(int)uVar1 >> 7;
      if (uVar1 < 0x4000) {
        target[2] = (uint8)uVar4;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar6 = target;
          puVar6[-1] = (byte)uVar4 | 0x80;
          uVar5 = uVar4 >> 7;
          target = puVar6 + 1;
          bVar3 = 0x3fff < uVar4;
          uVar4 = uVar5;
        } while (bVar3);
        *puVar6 = (uint8)uVar5;
      }
    }
  }
  if ((*(ulong *)&this->field_0x8 & 1) == 0) {
    return target;
  }
  puVar6 = (uint8 *)google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                              ((UnknownFieldSet *)
                               ((*(ulong *)&this->field_0x8 & 0xfffffffffffffffe) + 8),target,stream
                              );
  return puVar6;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* Person_PhoneNumber::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:Messages.Person.PhoneNumber)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // required string number = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_number().data(), static_cast<int>(this->_internal_number().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "Messages.Person.PhoneNumber.number");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_number(), target);
  }

  // optional .Messages.Person.PhoneType type = 2 [default = HOME];
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      2, this->_internal_type(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:Messages.Person.PhoneNumber)
  return target;
}